

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O0

int cuddZddGetCofactors2(DdManager *dd,DdNode *f,int v,DdNode **f1,DdNode **f0)

{
  DdNode *pDVar1;
  DdNode **f0_local;
  DdNode **f1_local;
  int v_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  pDVar1 = cuddZddSubset1(dd,f,v);
  *f1 = pDVar1;
  if (*f1 == (DdNode *)0x0) {
    dd_local._4_4_ = 1;
  }
  else {
    pDVar1 = cuddZddSubset0(dd,f,v);
    *f0 = pDVar1;
    if (*f0 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,*f1);
      dd_local._4_4_ = 1;
    }
    else {
      dd_local._4_4_ = 0;
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
cuddZddGetCofactors2(
  DdManager * dd,
  DdNode * f,
  int  v,
  DdNode ** f1,
  DdNode ** f0)
{
    *f1 = cuddZddSubset1(dd, f, v);
    if (*f1 == NULL)
        return(1);
    *f0 = cuddZddSubset0(dd, f, v);
    if (*f0 == NULL) {
        Cudd_RecursiveDerefZdd(dd, *f1);
        return(1);
    }
    return(0);

}